

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDyndepNotSpecified::~ParserTestDyndepNotSpecified(ParserTestDyndepNotSpecified *this)

{
  ParserTestDyndepNotSpecified *this_local;
  
  ~ParserTestDyndepNotSpecified(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, DyndepNotSpecified) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_FALSE(edge->dyndep_);
}